

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::Picker(Picker *this,QWidget *parent,WindowFlags f)

{
  PickerPrivate *this_00;
  undefined4 in_register_00000014;
  Picker *ctx;
  undefined1 local_38 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_28;
  
  QWidget::QWidget(&this->super_QWidget,parent,CONCAT44(in_register_00000014,f.i));
  *(undefined ***)this = &PTR_metaObject_001a83e0;
  *(undefined ***)&this->field_0x10 = &PTR__Picker_001a8590;
  this_00 = (PickerPrivate *)operator_new(0x88);
  ctx = this;
  PickerPrivate::PickerPrivate(this_00,this);
  (this->d).d = this_00;
  PickerPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  local_38._8_8_ = _q_scroll;
  QStack_28.d = (ScrollerPrivate *)0x0;
  QObject::connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::Picker::*)(int,int)>
            ((Object *)local_38,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

Picker::Picker( QWidget * parent, Qt::WindowFlags f )
	:	QWidget( parent, f )
	,	d( new PickerPrivate( this ) )
{
	d->init();

	connect( d->scroller, &Scroller::scroll,
		this, &Picker::_q_scroll );
}